

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

double vkt::shaderexecutor::anon_unknown_0::frexp(double __x,int *__exponent)

{
  bool bVar1;
  int iVar2;
  StorageType mantissa;
  size_t *in_RCX;
  uchar *sig;
  EVP_PKEY_CTX *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  float fVar3;
  int extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar4;
  int local_30;
  Float<unsigned_int,_8,_23,_127,_3U> local_28;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  EVP_PKEY_CTX *pEStack_20;
  Float32 fpValue;
  int *exponent_local;
  float *significand_local;
  float in_local;
  
  pEStack_20 = in_RSI;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_24,SUB84(__x,0));
  bVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isZero(&local_24);
  if (bVar1) {
    iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign(&local_24,in_RSI,sig,in_RCX,in_R8,in_R9);
    local_30 = -0x80000000;
    if (-1 < iVar2) {
      local_30 = 0;
    }
    uVar4 = 0;
    *__exponent = local_30;
    *(int *)pEStack_20 = 0;
  }
  else {
    iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign(&local_24,in_RSI,sig,in_RCX,in_R8,in_R9);
    mantissa = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(&local_24);
    local_28 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(iVar2,-1,mantissa);
    fVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_28);
    *__exponent = (int)fVar3;
    iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_24);
    *(int *)pEStack_20 = iVar2 + 1;
    local_30 = extraout_XMM0_Da;
    uVar4 = extraout_XMM0_Db;
  }
  return (double)CONCAT44(uVar4,local_30);
}

Assistant:

static inline void frexp (float in, float* significand, int* exponent)
{
	const tcu::Float32 fpValue(in);

	if (!fpValue.isZero())
	{
		// Construct float that has exactly the mantissa, and exponent of -1.
		*significand	= tcu::Float32::construct(fpValue.sign(), -1, fpValue.mantissa()).asFloat();
		*exponent		= fpValue.exponent()+1;
	}
	else
	{
		*significand	= fpValue.sign() < 0 ? -0.0f : 0.0f;
		*exponent		= 0;
	}
}